

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_io.c
# Opt level: O3

SAM_hdr * cram_read_SAM_hdr(cram_fd *fd)

{
  uint uVar1;
  uint uVar2;
  hFILE *fp;
  size_t sVar3;
  int iVar4;
  char *hdr;
  ulong __n;
  SAM_hdr *pSVar5;
  cram_container *c;
  cram_block *pcVar6;
  void *buffer;
  size_t sVar7;
  ulong uVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  size_t sVar13;
  ulong nbytes;
  int local_54;
  int local_44;
  size_t local_40;
  uchar *local_38;
  
  if ((fd->version & 0xffffff00U) == 0x100) {
    iVar4 = int32_decode(fd,&local_44);
    if (iVar4 == -1) {
      return (SAM_hdr *)0x0;
    }
    local_54 = local_44;
    nbytes = (ulong)local_44;
    hdr = (char *)malloc(nbytes + 1);
    if (hdr == (char *)0x0) {
      return (SAM_hdr *)0x0;
    }
    *hdr = '\0';
    fp = fd->fp;
    uVar8 = (long)fp->end - (long)fp->begin;
    __n = nbytes;
    if (uVar8 < nbytes) {
      __n = uVar8;
    }
    memcpy(hdr,fp->begin,__n);
    fp->begin = fp->begin + __n;
    if (uVar8 < nbytes) {
      __n = hread2(fp,hdr,nbytes,__n);
    }
    if (__n != nbytes) {
      return (SAM_hdr *)0x0;
    }
    fd->first_container = fd->first_container + nbytes + 4;
    goto LAB_001307ee;
  }
  c = cram_read_container(fd);
  if (c == (cram_container *)0x0) {
    return (SAM_hdr *)0x0;
  }
  if ((c->num_blocks < 1) || (pcVar6 = cram_read_block(fd), pcVar6 == (cram_block *)0x0)) {
LAB_00130b0b:
    cram_free_container(c);
  }
  else {
    cram_uncompress_block(pcVar6);
    uVar1 = pcVar6->content_id;
    iVar4 = fd->version;
    iVar9 = 1;
    iVar10 = 1;
    if ((0x7f < uVar1) && ((iVar10 = 2, 0x3fff < uVar1 && (iVar10 = 3, 0x1fffff < uVar1)))) {
      iVar10 = 5 - (uint)(uVar1 < 0x10000000);
    }
    uVar1 = pcVar6->comp_size;
    uVar2 = pcVar6->uncomp_size;
    if (((0x7f < (ulong)(long)(int)uVar2) && (iVar9 = 2, 0x3fff < uVar2)) &&
       (iVar9 = 3, 0x1fffff < uVar2)) {
      iVar9 = 5 - (uint)(uVar2 < 0x10000000);
    }
    iVar11 = 1;
    if (((0x7f < uVar1) && (iVar11 = 2, 0x3fff < uVar1)) && (iVar11 = 3, 0x1fffff < uVar1)) {
      iVar11 = 5 - (uint)(uVar1 < 0x10000000);
    }
    sVar3 = pcVar6->byte;
    if (3 < (long)(int)uVar2 - sVar3) {
      local_54 = *(int *)(pcVar6->data + sVar3);
      pcVar6->byte = sVar3 + 4;
      if (local_54 <= (int)(uVar2 - 4)) {
        local_40 = (size_t)local_54;
        local_38 = pcVar6->data;
        hdr = (char *)malloc(local_40 + 1);
        sVar13 = local_40;
        if (hdr != (char *)0x0) {
          iVar11 = uVar1 + 2 + (uint)(0x2ff < iVar4) * 4 + iVar10 + iVar9 + iVar11;
          memcpy(hdr,local_38 + sVar3 + 4,local_40);
          hdr[sVar13] = '\0';
          cram_free_block(pcVar6);
          if (1 < c->num_blocks) {
            iVar4 = 1;
            do {
              pcVar6 = cram_read_block(fd);
              if (pcVar6 == (cram_block *)0x0) goto LAB_00130b0b;
              uVar1 = pcVar6->content_id;
              iVar9 = 1;
              iVar10 = 1;
              if (((0x7f < uVar1) && (iVar10 = 2, 0x3fff < uVar1)) && (iVar10 = 3, 0x1fffff < uVar1)
                 ) {
                iVar10 = 5 - (uint)(uVar1 < 0x10000000);
              }
              uVar1 = pcVar6->uncomp_size;
              if (((0x7f < uVar1) && (iVar9 = 2, 0x3fff < uVar1)) && (iVar9 = 3, 0x1fffff < uVar1))
              {
                iVar9 = 5 - (uint)(uVar1 < 0x10000000);
              }
              uVar1 = pcVar6->comp_size;
              iVar12 = 1;
              if (((0x7f < uVar1) && (iVar12 = 2, 0x3fff < uVar1)) && (iVar12 = 3, 0x1fffff < uVar1)
                 ) {
                iVar12 = 5 - (uint)(uVar1 < 0x10000000);
              }
              iVar11 = iVar11 + uVar1 + iVar10 + iVar9 + (uint)(0x2ff < fd->version) * 4 + iVar12 +
                       2;
              cram_free_block(pcVar6);
              iVar4 = iVar4 + 1;
            } while (iVar4 < c->num_blocks);
          }
          iVar4 = c->length;
          if ((iVar4 != 0) && (iVar4 - iVar11 != 0 && iVar11 <= iVar4)) {
            sVar13 = (size_t)(iVar4 - iVar11);
            buffer = malloc(sVar13);
            if ((buffer == (void *)0x0) || (sVar7 = hread(fd->fp,buffer,sVar13), sVar7 != sVar13))
            goto LAB_00130b0b;
            free(buffer);
          }
          cram_free_container(c);
LAB_001307ee:
          pSVar5 = sam_hdr_parse_(hdr,local_54);
          free(hdr);
          return pSVar5;
        }
      }
    }
    cram_free_container(c);
    cram_free_block(pcVar6);
  }
  return (SAM_hdr *)0x0;
}

Assistant:

SAM_hdr *cram_read_SAM_hdr(cram_fd *fd) {
    int32_t header_len;
    char *header;
    SAM_hdr *hdr;

    /* 1.1 onwards stores the header in the first block of a container */
    if (CRAM_MAJOR_VERS(fd->version) == 1) {
	/* Length */
	if (-1 == int32_decode(fd, &header_len))
	    return NULL;

	/* Alloc and read */
	if (NULL == (header = malloc(header_len+1)))
	    return NULL;

	*header = 0;
	if (header_len != hread(fd->fp, header, header_len))
	    return NULL;

	fd->first_container += 4 + header_len;
    } else {
	cram_container *c = cram_read_container(fd);
	cram_block *b;
	int i, len;

	if (!c)
	    return NULL;

	if (c->num_blocks < 1) {
	    cram_free_container(c);
	    return NULL;
	}

	if (!(b = cram_read_block(fd))) {
	    cram_free_container(c);
	    return NULL;
	}
	cram_uncompress_block(b);

	len = b->comp_size + 2 + 4*(CRAM_MAJOR_VERS(fd->version) >= 3) +
	    itf8_size(b->content_id) + 
	    itf8_size(b->uncomp_size) + 
	    itf8_size(b->comp_size);

	/* Extract header from 1st block */
	if (-1 == int32_get(b, &header_len) ||
	    b->uncomp_size - 4 < header_len) {
	    cram_free_container(c);
	    cram_free_block(b);
	    return NULL;
	}
	if (NULL == (header = malloc(header_len+1))) {
	    cram_free_container(c);
	    cram_free_block(b);
	    return NULL;
	}
	memcpy(header, BLOCK_END(b), header_len);
	header[header_len]='\0';
	cram_free_block(b);

	/* Consume any remaining blocks */
	for (i = 1; i < c->num_blocks; i++) {
	    if (!(b = cram_read_block(fd))) {
		cram_free_container(c);
		return NULL;
	    }
	    len += b->comp_size + 2 + 4*(CRAM_MAJOR_VERS(fd->version) >= 3) +
		itf8_size(b->content_id) + 
		itf8_size(b->uncomp_size) + 
		itf8_size(b->comp_size);
	    cram_free_block(b);
	}

	if (c->length && c->length > len) {
	    // Consume padding
	    char *pads = malloc(c->length - len);
	    if (!pads) {
		cram_free_container(c);
		return NULL;
	    }

	    if (c->length - len != hread(fd->fp, pads, c->length - len)) {
		cram_free_container(c);
		return NULL;
	    }
	    free(pads);
	}

	cram_free_container(c);
    }

    /* Parse */
    hdr = sam_hdr_parse_(header, header_len);
    free(header);

    return hdr;
}